

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O3

int apply_patch(cJSON *object,cJSON *patch,cJSON_bool case_sensitive)

{
  uchar *pointer;
  uchar *puVar1;
  bool bVar2;
  int iVar3;
  cJSON_bool cVar4;
  long lVar5;
  long lVar6;
  cJSON *pcVar7;
  cJSON *pcVar8;
  uchar *puVar9;
  char *pcVar10;
  char *pcVar11;
  uchar *puVar12;
  uint uVar13;
  uint uVar14;
  long in_FS_OFFSET;
  size_t local_40;
  size_t index;
  
  index = *(size_t *)(in_FS_OFFSET + 0x28);
  if (case_sensitive == 0) {
    lVar5 = cJSON_GetObjectItem(patch,"path");
    iVar3 = cJSON_IsString(lVar5);
    if (iVar3 == 0) goto LAB_001017ee;
    lVar6 = cJSON_GetObjectItem(patch,"op");
  }
  else {
    lVar5 = cJSON_GetObjectItemCaseSensitive();
    iVar3 = cJSON_IsString(lVar5);
    if (iVar3 == 0) {
LAB_001017ee:
      uVar13 = 2;
      goto LAB_00101b98;
    }
    lVar6 = cJSON_GetObjectItemCaseSensitive(patch,"op");
  }
  iVar3 = cJSON_IsString(lVar6);
  if (iVar3 == 0) {
    uVar13 = 3;
    goto LAB_00101b98;
  }
  pcVar10 = *(char **)(lVar6 + 0x20);
  iVar3 = strcmp(pcVar10,"add");
  if (iVar3 == 0) {
    uVar14 = 1;
LAB_00101837:
    puVar9 = *(uchar **)(lVar5 + 0x20);
    if (*puVar9 == '\0') {
      pcVar7 = get_object_item(patch,"value",case_sensitive);
      if (pcVar7 != (cJSON *)0x0) {
        pcVar7 = (cJSON *)cJSON_Duplicate(pcVar7,1);
        if (pcVar7 != (cJSON *)0x0) {
          overwrite_item(object,*pcVar7);
          cJSON_free(pcVar7);
          uVar13 = 0;
          if (object->string != (char *)0x0) {
            cJSON_free();
            object->string = (char *)0x0;
            uVar13 = 0;
          }
          goto LAB_00101b98;
        }
        goto LAB_00101a47;
      }
      goto LAB_00101a3c;
    }
LAB_0010190f:
    if ((uVar14 & 0xfffffffe) != 4) {
      if ((uVar14 & 0xfffffffe) == 2) {
        bVar2 = false;
        goto LAB_00101926;
      }
      goto LAB_0010196f;
    }
    if (case_sensitive == 0) {
      lVar6 = cJSON_GetObjectItem(patch,"from");
    }
    else {
      lVar6 = cJSON_GetObjectItemCaseSensitive();
    }
    if (lVar6 == 0) {
      uVar13 = 4;
      goto LAB_00101b98;
    }
    uVar13 = 5;
    if (uVar14 == 5) {
      pcVar7 = get_item_from_pointer(object,*(char **)(lVar6 + 0x20),case_sensitive);
      if (pcVar7 == (cJSON *)0x0) goto LAB_00101b98;
      pcVar7 = (cJSON *)cJSON_Duplicate(pcVar7,1);
      if (pcVar7 == (cJSON *)0x0) {
        uVar13 = 6;
        goto LAB_00101b98;
      }
    }
    else if ((uVar14 != 4) ||
            (pcVar7 = detach_path(object,*(uchar **)(lVar6 + 0x20),case_sensitive),
            pcVar7 == (cJSON *)0x0)) goto LAB_00101b98;
  }
  else {
    iVar3 = strcmp(pcVar10,"remove");
    if (iVar3 != 0) {
      iVar3 = strcmp(pcVar10,"replace");
      if (iVar3 == 0) {
        uVar14 = 3;
        goto LAB_00101837;
      }
      iVar3 = strcmp(pcVar10,"move");
      if (iVar3 == 0) {
        uVar14 = 4;
      }
      else {
        iVar3 = strcmp(pcVar10,"copy");
        if (iVar3 != 0) {
          iVar3 = strcmp(pcVar10,"test");
          uVar13 = 3;
          if (iVar3 == 0) {
            pcVar7 = get_item_from_pointer(object,*(char **)(lVar5 + 0x20),case_sensitive);
            if (case_sensitive == 0) {
              pcVar8 = (cJSON *)cJSON_GetObjectItem(patch,"value");
            }
            else {
              pcVar8 = (cJSON *)cJSON_GetObjectItemCaseSensitive();
            }
            cVar4 = compare_json(pcVar7,pcVar8,case_sensitive);
            uVar13 = (uint)(cVar4 == 0);
          }
          goto LAB_00101b98;
        }
        uVar14 = 5;
      }
      puVar9 = *(uchar **)(lVar5 + 0x20);
      goto LAB_0010190f;
    }
    puVar9 = *(uchar **)(lVar5 + 0x20);
    if (*puVar9 == '\0') {
      overwrite_item(object,(cJSON)ZEXT1664(ZEXT816(0)));
      uVar13 = 0;
      goto LAB_00101b98;
    }
    bVar2 = true;
LAB_00101926:
    pcVar7 = detach_path(object,puVar9,case_sensitive);
    if (pcVar7 == (cJSON *)0x0) {
      uVar13 = 0xd;
      goto LAB_00101b98;
    }
    cJSON_Delete(pcVar7);
    uVar13 = 0;
    if (bVar2) goto LAB_00101b98;
LAB_0010196f:
    if (case_sensitive == 0) {
      lVar6 = cJSON_GetObjectItem(patch,"value");
    }
    else {
      lVar6 = cJSON_GetObjectItemCaseSensitive();
    }
    if (lVar6 == 0) {
LAB_00101a3c:
      uVar13 = 7;
      goto LAB_00101b98;
    }
    pcVar7 = (cJSON *)cJSON_Duplicate(lVar6,1);
    if (pcVar7 == (cJSON *)0x0) {
LAB_00101a47:
      uVar13 = 8;
      goto LAB_00101b98;
    }
  }
  puVar9 = cJSONUtils_strdup(*(uchar **)(lVar5 + 0x20));
  if ((puVar9 != (uchar *)0x0) && (pcVar10 = strrchr((char *)puVar9,0x2f), pcVar10 != (char *)0x0))
  {
    *pcVar10 = '\0';
    pointer = (uchar *)(pcVar10 + 1);
    pcVar8 = get_item_from_pointer(object,(char *)puVar9,case_sensitive);
    pcVar11 = pcVar10 + 2;
    puVar12 = pointer;
    do {
      if (*puVar12 == '~') {
        puVar1 = puVar12 + 1;
        puVar12 = puVar12 + 1;
        if (*puVar1 == '1') {
          *pcVar11 = '/';
        }
        else {
          if (*puVar1 != '0') goto LAB_00101ada;
          pcVar11[-1] = '~';
        }
      }
      else if (*puVar12 == '\0') goto LAB_00101ad6;
      puVar12 = puVar12 + 1;
      pcVar11 = pcVar11 + 1;
    } while( true );
  }
  get_item_from_pointer(object,(char *)puVar9,case_sensitive);
  uVar13 = 9;
LAB_00101a69:
  cJSON_Delete(pcVar7);
  goto LAB_00101a71;
LAB_00101ad6:
  pcVar11[-1] = '\0';
LAB_00101ada:
  uVar13 = 9;
  if (pcVar8 == (cJSON *)0x0) goto LAB_00101a69;
  iVar3 = cJSON_IsArray(pcVar8);
  if (iVar3 == 0) {
    iVar3 = cJSON_IsObject(pcVar8);
    if (iVar3 != 0) {
      if (case_sensitive == 0) {
        cJSON_DeleteItemFromObject(pcVar8,pointer);
      }
      else {
        cJSON_DeleteItemFromObjectCaseSensitive(pcVar8,pointer);
      }
      cJSON_AddItemToObject(pcVar8,pointer,pcVar7);
      goto LAB_00101c15;
    }
    goto LAB_00101a69;
  }
  if ((*pointer != '-') || (pcVar10[2] != '\0')) {
    local_40 = 0;
    cVar4 = decode_array_index_from_pointer(pointer,&local_40);
    if (cVar4 == 0) {
      uVar13 = 0xb;
    }
    else {
      cVar4 = insert_item_in_array(pcVar8,local_40,pcVar7);
      if (cVar4 != 0) goto LAB_00101c15;
      uVar13 = 10;
    }
    goto LAB_00101a69;
  }
  cJSON_AddItemToArray(pcVar8,pcVar7);
LAB_00101c15:
  uVar13 = 0;
LAB_00101a71:
  if (puVar9 != (uchar *)0x0) {
    cJSON_free(puVar9);
  }
LAB_00101b98:
  if (*(size_t *)(in_FS_OFFSET + 0x28) != index) {
    __stack_chk_fail();
  }
  return uVar13;
}

Assistant:

static int apply_patch(cJSON *object, const cJSON *patch, const cJSON_bool case_sensitive)
{
    cJSON *path = NULL;
    cJSON *value = NULL;
    cJSON *parent = NULL;
    enum patch_operation opcode = INVALID;
    unsigned char *parent_pointer = NULL;
    unsigned char *child_pointer = NULL;
    int status = 0;

    path = get_object_item(patch, "path", case_sensitive);
    if (!cJSON_IsString(path))
    {
        /* malformed patch. */
        status = 2;
        goto cleanup;
    }

    opcode = decode_patch_operation(patch, case_sensitive);
    if (opcode == INVALID)
    {
        status = 3;
        goto cleanup;
    }
    else if (opcode == TEST)
    {
        /* compare value: {...} with the given path */
        status = !compare_json(get_item_from_pointer(object, path->valuestring, case_sensitive), get_object_item(patch, "value", case_sensitive), case_sensitive);
        goto cleanup;
    }

    /* special case for replacing the root */
    if (path->valuestring[0] == '\0')
    {
        if (opcode == REMOVE)
        {
            static const cJSON invalid = { NULL, NULL, NULL, cJSON_Invalid, NULL, 0, 0, NULL};

            overwrite_item(object, invalid);

            status = 0;
            goto cleanup;
        }

        if ((opcode == REPLACE) || (opcode == ADD))
        {
            value = get_object_item(patch, "value", case_sensitive);
            if (value == NULL)
            {
                /* missing "value" for add/replace. */
                status = 7;
                goto cleanup;
            }

            value = cJSON_Duplicate(value, 1);
            if (value == NULL)
            {
                /* out of memory for add/replace. */
                status = 8;
                goto cleanup;
            }

            overwrite_item(object, *value);

            /* delete the duplicated value */
            cJSON_free(value);
            value = NULL;

            /* the string "value" isn't needed */
            if (object->string != NULL)
            {
                cJSON_free(object->string);
                object->string = NULL;
            }

            status = 0;
            goto cleanup;
        }
    }

    if ((opcode == REMOVE) || (opcode == REPLACE))
    {
        /* Get rid of old. */
        cJSON *old_item = detach_path(object, (unsigned char*)path->valuestring, case_sensitive);
        if (old_item == NULL)
        {
            status = 13;
            goto cleanup;
        }
        cJSON_Delete(old_item);
        if (opcode == REMOVE)
        {
            /* For Remove, this job is done. */
            status = 0;
            goto cleanup;
        }
    }

    /* Copy/Move uses "from". */
    if ((opcode == MOVE) || (opcode == COPY))
    {
        cJSON *from = get_object_item(patch, "from", case_sensitive);
        if (from == NULL)
        {
            /* missing "from" for copy/move. */
            status = 4;
            goto cleanup;
        }

        if (opcode == MOVE)
        {
            value = detach_path(object, (unsigned char*)from->valuestring, case_sensitive);
        }
        if (opcode == COPY)
        {
            value = get_item_from_pointer(object, from->valuestring, case_sensitive);
        }
        if (value == NULL)
        {
            /* missing "from" for copy/move. */
            status = 5;
            goto cleanup;
        }
        if (opcode == COPY)
        {
            value = cJSON_Duplicate(value, 1);
        }
        if (value == NULL)
        {
            /* out of memory for copy/move. */
            status = 6;
            goto cleanup;
        }
    }
    else /* Add/Replace uses "value". */
    {
        value = get_object_item(patch, "value", case_sensitive);
        if (value == NULL)
        {
            /* missing "value" for add/replace. */
            status = 7;
            goto cleanup;
        }
        value = cJSON_Duplicate(value, 1);
        if (value == NULL)
        {
            /* out of memory for add/replace. */
            status = 8;
            goto cleanup;
        }
    }

    /* Now, just add "value" to "path". */

    /* split pointer in parent and child */
    parent_pointer = cJSONUtils_strdup((unsigned char*)path->valuestring);
    if (parent_pointer) {
        child_pointer = (unsigned char*)strrchr((char*)parent_pointer, '/');
    }
    if (child_pointer != NULL)
    {
        child_pointer[0] = '\0';
        child_pointer++;
    }
    parent = get_item_from_pointer(object, (char*)parent_pointer, case_sensitive);
    decode_pointer_inplace(child_pointer);

    /* add, remove, replace, move, copy, test. */
    if ((parent == NULL) || (child_pointer == NULL))
    {
        /* Couldn't find object to add to. */
        status = 9;
        goto cleanup;
    }
    else if (cJSON_IsArray(parent))
    {
        if (strcmp((char*)child_pointer, "-") == 0)
        {
            cJSON_AddItemToArray(parent, value);
            value = NULL;
        }
        else
        {
            size_t index = 0;
            if (!decode_array_index_from_pointer(child_pointer, &index))
            {
                status = 11;
                goto cleanup;
            }

            if (!insert_item_in_array(parent, index, value))
            {
                status = 10;
                goto cleanup;
            }
            value = NULL;
        }
    }
    else if (cJSON_IsObject(parent))
    {
        if (case_sensitive)
        {
            cJSON_DeleteItemFromObjectCaseSensitive(parent, (char*)child_pointer);
        }
        else
        {
            cJSON_DeleteItemFromObject(parent, (char*)child_pointer);
        }
        cJSON_AddItemToObject(parent, (char*)child_pointer, value);
        value = NULL;
    }
    else /* parent is not an object */
    {
        /* Couldn't find object to add to. */
        status = 9;
        goto cleanup;
    }

cleanup:
    if (value != NULL)
    {
        cJSON_Delete(value);
    }
    if (parent_pointer != NULL)
    {
        cJSON_free(parent_pointer);
    }

    return status;
}